

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_protocol_test.cpp
# Opt level: O2

void protocol_Parse_withTooBigPaddingV0_failsToReadPacket(void)

{
  ProtocolVersion PVar1;
  string packet_buffer;
  string user_data;
  Packet packet;
  string sStack_88;
  string local_68;
  Packet local_48;
  
  std::__cxx11::string::string((string *)&local_68,"user data",(allocator *)&local_48);
  CreatePacketV0(&sStack_88,&local_68,0x8001);
  local_48.user_data_._M_dataplus._M_p = (pointer)&local_48.user_data_.field_2;
  local_48.user_data_._M_string_length = 0;
  local_48.user_data_.field_2._M_local_buf[0] = '\0';
  PVar1 = udpdiscovery::Packet::Parse(&local_48,&sStack_88);
  if (PVar1 == kProtocolVersionUnknown) {
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    return;
  }
  __assert_fail("packet.Parse(packet_buffer) == udpdiscovery::kProtocolVersionUnknown",
                "/workspace/llm4binary/github/license_c_cmakelists/truvorskameikin[P]udp-discovery-cpp/udp_discovery_protocol_test.cpp"
                ,0x9b,"void protocol_Parse_withTooBigPaddingV0_failsToReadPacket()");
}

Assistant:

void protocol_Parse_withTooBigPaddingV0_failsToReadPacket() {
  std::string user_data("user data");
  std::string packet_buffer =
      CreatePacketV0(user_data, udpdiscovery::kMaxPaddingSizeV0 + 1);

  udpdiscovery::Packet packet;
  assert(packet.Parse(packet_buffer) == udpdiscovery::kProtocolVersionUnknown);
}